

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

ImportCacheValue * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::importData
          (Interpreter *this,LocationRange *loc,LiteralString *file)

{
  int iVar1;
  mapped_type *ppIVar2;
  char *__lhs;
  undefined8 uVar3;
  mapped_type this_00;
  long in_RDX;
  long in_RDI;
  bool in_stack_00000057;
  UString *in_stack_00000058;
  ImportCacheValue *input_ptr;
  string msg;
  string epath;
  string input;
  int result;
  size_t buflen;
  char *buf;
  char *found_here_cptr;
  ImportCacheValue *cached_value;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  key;
  UString *path;
  string dir;
  string *in_stack_fffffffffffffdf8;
  mapped_type pIVar4;
  ImportCacheValue *in_stack_fffffffffffffe00;
  Interpreter *in_stack_fffffffffffffe08;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffffe10;
  UString *in_stack_fffffffffffffe18;
  UString *s;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  *in_stack_fffffffffffffe20;
  ulong uVar5;
  string *in_stack_fffffffffffffe28;
  allocator *paVar6;
  key_type *in_stack_fffffffffffffe38;
  key_type *__k;
  map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>_>
  *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string local_190 [32];
  string local_170 [103];
  allocator local_109;
  string local_108 [32];
  string local_e8 [36];
  int local_c4;
  ulong local_c0;
  UString *local_b8;
  char *local_b0;
  undefined4 local_a4;
  mapped_type local_a0;
  long local_48;
  string local_40 [32];
  long local_20;
  mapped_type local_8;
  
  local_20 = in_RDX;
  path_dir_with_trailing_separator(in_stack_fffffffffffffe28);
  local_48 = local_20 + 0x80;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (in_stack_fffffffffffffe20,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  ppIVar2 = std::
            map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>_>
            ::operator[](in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  local_a0 = *ppIVar2;
  if (local_a0 == (mapped_type)0x0) {
    local_b8 = (UString *)0x0;
    local_c0 = 0;
    __k = *(key_type **)(in_RDI + 0x158);
    __rhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RDI + 0x160);
    __lhs = (char *)std::__cxx11::string::c_str();
    encode_utf8(in_stack_fffffffffffffe18);
    uVar3 = std::__cxx11::string::c_str();
    iVar1 = (*(code *)__k)(__rhs,__lhs,uVar3,&local_b0,&local_b8,&local_c0);
    std::__cxx11::string::~string(local_e8);
    paVar6 = &local_109;
    s = local_b8;
    uVar5 = local_c0;
    local_c4 = iVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,(char *)s,uVar5,paVar6);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    free(local_b8);
    if (local_c4 == 1) {
      jsonnet_string_escape(in_stack_00000058,in_stack_00000057);
      encode_utf8(s);
      std::__cxx11::u32string::~u32string
                ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 in_stack_fffffffffffffe00);
      std::operator+(__lhs,__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00);
      std::__cxx11::string::~string(local_190);
      std::__cxx11::string::operator+=(local_170,local_108);
      uVar3 = __cxa_allocate_exception(0x38);
      makeError(in_stack_fffffffffffffe08,(LocationRange *)in_stack_fffffffffffffe00,
                in_stack_fffffffffffffdf8);
      __cxa_throw(uVar3,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
    }
    this_00 = (mapped_type)operator_new(0x48);
    (this_00->content).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(this_00->content).field_2 + 8) = 0;
    *(undefined8 *)&this_00->content = 0;
    (this_00->content)._M_string_length = 0;
    (this_00->foundHere).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(this_00->foundHere).field_2 + 8) = 0;
    *(undefined8 *)&this_00->foundHere = 0;
    (this_00->foundHere)._M_string_length = 0;
    this_00->thunk = (HeapThunk *)0x0;
    ImportCacheValue::ImportCacheValue(in_stack_fffffffffffffe00);
    std::__cxx11::string::operator=((string *)this_00,local_b0);
    std::__cxx11::string::operator=((string *)&this_00->content,local_108);
    this_00->thunk = (HeapThunk *)0x0;
    free(local_b0);
    pIVar4 = this_00;
    in_stack_fffffffffffffe00 =
         (ImportCacheValue *)
         std::
         map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>_>
         ::operator[]((map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>_>
                       *)__rhs,__k);
    *(mapped_type *)&in_stack_fffffffffffffe00->foundHere = pIVar4;
    local_a4 = 1;
    local_8 = this_00;
    std::__cxx11::string::~string(local_108);
  }
  else {
    local_a4 = 1;
    local_8 = local_a0;
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
           *)in_stack_fffffffffffffe00);
  std::__cxx11::string::~string(local_40);
  return local_8;
}

Assistant:

ImportCacheValue *importData(const LocationRange &loc, const LiteralString *file)
    {
        // `dir` is passed to the importCallback, which may be externally defined.
        // For backwards compatibility, we need to keep the trailing directory separator.
        // For example, the default callback in libjsonnet.cpp joins paths with simple
        // string concatenation. Other (external) implementations might do the same.
        std::string dir = path_dir_with_trailing_separator(loc.file);

        const UString &path = file->value;

        std::pair<std::string, UString> key(dir, path);
        ImportCacheValue *cached_value = cachedImports[key];
        if (cached_value != nullptr)
            return cached_value;

        char *found_here_cptr;
        char *buf = NULL;
        size_t buflen = 0;
        int result = importCallback(importCallbackContext,
                                    dir.c_str(),
                                    encode_utf8(path).c_str(),
                                    &found_here_cptr,
                                    &buf,
                                    &buflen);

        std::string input(buf, buflen);
        ::free(buf);

        if (result == 1) {  // failure
            std::string epath = encode_utf8(jsonnet_string_escape(path, false));
            std::string msg = "couldn't open import \"" + epath + "\": ";
            msg += input;
            throw makeError(loc, msg);
        }

        auto *input_ptr = new ImportCacheValue();
        input_ptr->foundHere = found_here_cptr;
        input_ptr->content = input;
        input_ptr->thunk = nullptr;  // May be filled in later by import().
        ::free(found_here_cptr);
        cachedImports[key] = input_ptr;
        return input_ptr;
    }